

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O0

void __thiscall rtb::Concurrency::Queue<int>::unsubscribe(Queue<int> *this)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  key_type local_90;
  key_type local_88;
  int local_7c;
  iterator iStack_78;
  int i;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> local_70;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> local_68;
  int local_5c;
  id iStack_58;
  int otherMaxMsgToRead;
  _Base_ptr local_50;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> local_48;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> local_40;
  int local_38;
  int myMsgToRead_1;
  undefined4 local_24;
  undefined1 local_20 [4];
  int myMsgToRead;
  unique_lock<std::mutex> mlock;
  Queue<int> *this_local;
  
  mlock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex_);
  local_24 = 0;
  bVar1 = someoneSlowerThanMe(this);
  if (bVar1) {
    local_88._M_thread = (native_handle_type)std::this_thread::get_id();
    std::
    map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::erase(&this->subscribersMissingRead_,&local_88);
  }
  else {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
         ::begin(&this->subscribersMissingRead_);
    local_50 = (_Base_ptr)
               std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::end(&this->subscribersMissingRead_);
    local_40 = std::
               max_element<std::_Rb_tree_iterator<std::pair<std::thread::id_const,int>>,bool(*)(std::pair<std::thread::id,int>const&,std::pair<std::thread::id,int>const&)>
                         (local_48,(_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>)
                                   local_50,pred);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>::operator->(&local_40);
    local_38 = ppVar2->second;
    iStack_58 = std::this_thread::get_id();
    std::
    map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::erase(&this->subscribersMissingRead_,&stack0xffffffffffffffa8);
    local_5c = 0;
    sVar3 = std::
            map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
            ::size(&this->subscribersMissingRead_);
    if (sVar3 != 0) {
      local_70._M_node =
           (_Base_ptr)
           std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::begin(&this->subscribersMissingRead_);
      iStack_78 = std::
                  map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                  ::end(&this->subscribersMissingRead_);
      local_68 = std::
                 max_element<std::_Rb_tree_iterator<std::pair<std::thread::id_const,int>>,bool(*)(std::pair<std::thread::id,int>const&,std::pair<std::thread::id,int>const&)>
                           (local_70,iStack_78._M_node,pred);
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>::operator->(&local_68)
      ;
      local_5c = ppVar2->second;
    }
    for (local_7c = 0; local_7c < local_5c - local_38; local_7c = local_7c + 1) {
      std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::pop_front
                (&this->queue_);
    }
  }
  local_90._M_thread = (native_handle_type)std::this_thread::get_id();
  std::
  map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  ::erase(&this->subscribersNextRead_,&local_90);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void Queue<T>::unsubscribe() {
        std::unique_lock<std::mutex> mlock(mutex_);

        int myMsgToRead = 0;
        if (!someoneSlowerThanMe()) {
            int myMsgToRead = std::max_element(
                subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                                  ->second;
            subscribersMissingRead_.erase(std::this_thread::get_id());
            int otherMaxMsgToRead = 0;
            if (subscribersMissingRead_.size() != 0)
                otherMaxMsgToRead = std::max_element(
                    subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                                        ->second;
            for (int i = 0; i < (otherMaxMsgToRead - myMsgToRead); ++i)
                queue_.pop_front();
        } else
            subscribersMissingRead_.erase(std::this_thread::get_id());

        subscribersNextRead_.erase(std::this_thread::get_id());

        mlock.unlock();
    }